

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O0

int4 __thiscall TypePointer::compareDependency(TypePointer *this,Datatype *op)

{
  int iVar1;
  type_metatype tVar2;
  int4 iVar3;
  type_metatype tVar4;
  TypePointer *tp;
  Datatype *op_local;
  TypePointer *this_local;
  
  iVar1 = (this->super_Datatype).size;
  iVar3 = Datatype::getSize(op);
  if (iVar1 == iVar3) {
    tVar2 = (this->super_Datatype).metatype;
    tVar4 = Datatype::getMetatype(op);
    if (tVar2 == tVar4) {
      if (this->wordsize == op[1].size) {
        if (this->ptrto == (Datatype *)op[1]._vptr_Datatype) {
          this_local._4_4_ = 0;
        }
        else {
          this_local._4_4_ = 1;
          if (this->ptrto < (Datatype *)op[1]._vptr_Datatype) {
            this_local._4_4_ = -1;
          }
        }
      }
      else {
        this_local._4_4_ = 1;
        if (this->wordsize < (uint)op[1].size) {
          this_local._4_4_ = -1;
        }
      }
    }
    else {
      tVar2 = (this->super_Datatype).metatype;
      tVar4 = Datatype::getMetatype(op);
      this_local._4_4_ = 1;
      if ((int)tVar2 < (int)tVar4) {
        this_local._4_4_ = -1;
      }
    }
  }
  else {
    iVar3 = Datatype::getSize(op);
    this_local._4_4_ = iVar3 - (this->super_Datatype).size;
  }
  return this_local._4_4_;
}

Assistant:

int4 TypePointer::compareDependency(const Datatype &op) const

{
  TypePointer *tp;

  if (size != op.getSize()) return (op.getSize()-size);
  if (metatype != op.getMetatype()) return (metatype < op.getMetatype()) ? -1 : 1;
  // Both must be pointers
  tp = (TypePointer *) &op;
  if (wordsize != tp->wordsize) return (wordsize < tp->wordsize) ? -1 : 1;
  if (ptrto == tp->ptrto) return 0;
  return (ptrto < tp->ptrto) ? -1 : 1; // Compare the absolute pointers
}